

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueRenderResource.h
# Opt level: O2

UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
* __thiscall
Rml::
UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
::operator=(UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
            *this,UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                  *other)

{
  StableVectorIndex SVar1;
  RenderManager *pRVar2;
  
  CallbackTexture::Release((CallbackTexture *)this);
  pRVar2 = other->render_manager;
  other->render_manager = (RenderManager *)0x0;
  this->render_manager = pRVar2;
  SVar1 = other->resource_handle;
  other->resource_handle = Invalid;
  this->resource_handle = SVar1;
  return this;
}

Assistant:

UniqueRenderResource& operator=(UniqueRenderResource&& other) noexcept
	{
		ReleaseInDerived();
		MoveFrom(other);
		return *this;
	}